

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_max_operations.c
# Opt level: O0

int16_t WebRtcSpl_MinValueW16C(int16_t *vector,size_t length)

{
  ulong local_28;
  size_t i;
  int16_t minimum;
  size_t length_local;
  int16_t *vector_local;
  
  i._6_2_ = 0x7fff;
  if (length != 0) {
    for (local_28 = 0; local_28 < length; local_28 = local_28 + 1) {
      if (vector[local_28] < i._6_2_) {
        i._6_2_ = vector[local_28];
      }
    }
    return i._6_2_;
  }
  __assert_fail("length > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/signal_processing/min_max_operations.c"
                ,0x72,"int16_t WebRtcSpl_MinValueW16C(const int16_t *, size_t)");
}

Assistant:

int16_t WebRtcSpl_MinValueW16C(const int16_t* vector, size_t length) {
  int16_t minimum = WEBRTC_SPL_WORD16_MAX;
  size_t i = 0;

  assert(length > 0);

  for (i = 0; i < length; i++) {
    if (vector[i] < minimum)
      minimum = vector[i];
  }
  return minimum;
}